

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O2

bool __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
::Clean(WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
        *this)

{
  if ((this->disableCleanup == false) &&
     (this->recycler->weakReferenceCleanupId != this->lastWeakReferenceCleanupId)) {
    WeaklyReferencedKeyDictionary<Js::EntryPointInfo,unsigned_char,DefaultComparer<Js::EntryPointInfo_const*>,true>
    ::
    Map<JsUtil::WeaklyReferencedKeyDictionary<Js::EntryPointInfo,unsigned_char,DefaultComparer<Js::EntryPointInfo_const*>,true>::Clean()::_lambda(Js::EntryPointInfo*,unsigned_char,Memory::RecyclerWeakReference<Js::EntryPointInfo>const*)_1_>
              ((WeaklyReferencedKeyDictionary<Js::EntryPointInfo,unsigned_char,DefaultComparer<Js::EntryPointInfo_const*>,true>
                *)this);
    this->lastWeakReferenceCleanupId = this->recycler->weakReferenceCleanupId;
  }
  return 0 < this->freeCount;
}

Assistant:

bool Clean()
        {
            if (!disableCleanup && recycler->GetWeakReferenceCleanupId() != this->lastWeakReferenceCleanupId)
            {
                Map([](TKey * key, TValue value, const RecyclerWeakReference<TKey>* weakRef) {});
                this->lastWeakReferenceCleanupId = recycler->GetWeakReferenceCleanupId();
            }

            return freeCount > 0;
        }